

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

boolean toptenlist_insert(toptenentry *ttlist,toptenentry *newtt)

{
  int iVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int occ_cnt;
  int del;
  int ins;
  int i;
  toptenentry *newtt_local;
  toptenentry *ttlist_local;
  
  local_30 = 0;
  occ_cnt = 0;
  while( true ) {
    bVar2 = false;
    if ((occ_cnt < 10000) && (bVar2 = true, ttlist[occ_cnt].points < 1)) {
      bVar2 = ttlist[occ_cnt].deathlev != 0;
    }
    if ((!bVar2) || (ttlist[occ_cnt].points < newtt->points)) break;
    iVar1 = strncmp(newtt->name,ttlist[occ_cnt].name,0xf);
    if (iVar1 == 0) {
      local_30 = local_30 + 1;
    }
    occ_cnt = occ_cnt + 1;
  }
  if ((local_30 < 1000) && (occ_cnt != 10000)) {
    local_2c = occ_cnt;
    while( true ) {
      bVar2 = false;
      if ((local_2c < 10000) && (bVar2 = true, ttlist[local_2c].points < 1)) {
        bVar2 = ttlist[local_2c].deathlev != 0;
      }
      if ((!bVar2) ||
         ((iVar1 = strncmp(newtt->name,ttlist[occ_cnt].name,0xf), iVar1 == 0 &&
          (local_30 = local_30 + 1, 999 < local_30)))) break;
      local_2c = local_2c + 1;
    }
    if (local_2c == 10000) {
      local_2c = 9999;
    }
    for (del = local_2c; occ_cnt < del; del = del + -1) {
      memcpy(ttlist + del,ttlist + (del + -1),0xc0);
    }
    memcpy(ttlist + occ_cnt,newtt,0xc0);
    ttlist_local._7_1_ = '\x01';
  }
  else {
    ttlist_local._7_1_ = '\0';
  }
  return ttlist_local._7_1_;
}

Assistant:

static boolean toptenlist_insert(struct toptenentry *ttlist, struct toptenentry *newtt)
{
    int i, ins, del, occ_cnt;
    occ_cnt = 0;
    
    for (ins = 0; ins < TTLISTLEN && validentry(ttlist[ins]); ins++) {
	if (newtt->points > ttlist[ins].points)
	    break;
	
	if (!strncmp(newtt->name, ttlist[ins].name, NAMSZ))
	    occ_cnt++;
    }
    
    if (occ_cnt >= PLAYERMAX || ins == TTLISTLEN)
	/* this game doesn't get onto the list */
	return FALSE;
    
    /* If the player already has PLAYERMAX entries in the list, find the last one.
     * Otherwise del is either the first empty entry or TTLISTLEN if the list is full */
    for (del = ins; del < TTLISTLEN && validentry(ttlist[del]); del++) {
	if (!strncmp(newtt->name, ttlist[ins].name, NAMSZ)) {
	    occ_cnt++;
	    if (occ_cnt >= PLAYERMAX)
		break;
	}
    }
    
    if (del == TTLISTLEN)
	del--;
    
    /* shift the entries in the range [ins;del[ down by one, overwriting del */
    for (i = del; i > ins; i--)
	ttlist[i] = ttlist[i-1];
    
    ttlist[ins] = *newtt;
    
    return TRUE;
}